

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManInvertConstraints(Gia_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined4 local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pAig_local;
  
  iVar1 = Gia_ManConstrNum(pAig);
  if (iVar1 != 0) {
    local_1c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(pAig);
      bVar3 = false;
      if (local_1c < iVar1) {
        pGStack_18 = Gia_ManCo(pAig,local_1c);
        bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ManPoNum(pAig);
      iVar2 = Gia_ManConstrNum(pAig);
      if (iVar1 - iVar2 <= local_1c) {
        Gia_ObjFlipFaninC0(pGStack_18);
      }
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void Gia_ManInvertConstraints( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i;
    if ( Gia_ManConstrNum(pAig) == 0 )
        return;
    Gia_ManForEachPo( pAig, pObj, i )
        if ( i >= Gia_ManPoNum(pAig) - Gia_ManConstrNum(pAig) )
            Gia_ObjFlipFaninC0( pObj );
}